

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint32(CodedOutputStream *this,uint32 value)

{
  byte *pbVar1;
  int local_50;
  byte local_49;
  int size_1;
  undefined1 auStack_44 [3];
  uint8 bytes [5];
  int size;
  uint8 *end;
  uint8 *target;
  uint32 value_local;
  CodedOutputStream *this_local;
  byte *local_10;
  
  if (this->buffer_size_ < 5) {
    local_50 = 0;
    for (target._4_4_ = value; 0x7f < target._4_4_; target._4_4_ = target._4_4_ >> 7) {
      (&local_49)[local_50] = (byte)target._4_4_ & 0x7f | 0x80;
      local_50 = local_50 + 1;
    }
    (&local_49)[local_50] = (byte)target._4_4_ & 0x7f;
    WriteRaw(this,&local_49,local_50 + 1);
  }
  else {
    pbVar1 = this->buffer_;
    *pbVar1 = (byte)value | 0x80;
    if (value < 0x80) {
      *pbVar1 = *pbVar1 & 0x7f;
      local_10 = pbVar1 + 1;
    }
    else {
      pbVar1[1] = (byte)(value >> 7) | 0x80;
      if (value < 0x4000) {
        pbVar1[1] = pbVar1[1] & 0x7f;
        local_10 = pbVar1 + 2;
      }
      else {
        pbVar1[2] = (byte)(value >> 0xe) | 0x80;
        if (value < 0x200000) {
          pbVar1[2] = pbVar1[2] & 0x7f;
          local_10 = pbVar1 + 3;
        }
        else {
          pbVar1[3] = (byte)(value >> 0x15) | 0x80;
          if (value < 0x10000000) {
            pbVar1[3] = pbVar1[3] & 0x7f;
            local_10 = pbVar1 + 4;
          }
          else {
            pbVar1[4] = (byte)(value >> 0x1c);
            local_10 = pbVar1 + 5;
          }
        }
      }
    }
    stack0xffffffffffffffc0 = local_10;
    _auStack_44 = (int)local_10 - (int)pbVar1;
    Advance(this,_auStack_44);
  }
  return;
}

Assistant:

void CodedOutputStream::WriteVarint32(uint32 value) {
  if (buffer_size_ >= kMaxVarint32Bytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint32FallbackToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarint32Bytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}